

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colList.c
# Opt level: O2

Col_Word NewMConcatList(Col_Word left,Col_Word right)

{
  byte bVar1;
  byte bVar2;
  size_t sVar3;
  size_t sVar4;
  Cell *pacVar5;
  undefined2 uVar6;
  
  bVar1 = GetDepth(left);
  bVar2 = GetDepth(right);
  sVar3 = Col_ListLength(left);
  sVar4 = Col_ListLength(right);
  pacVar5 = AllocCells(1);
  (*pacVar5)[0] = '&';
  if (bVar2 < bVar1) {
    bVar2 = bVar1;
  }
  (*pacVar5)[1] = bVar2 + 1;
  *(size_t *)(*pacVar5 + 8) = sVar4 + sVar3;
  uVar6 = (undefined2)sVar3;
  if (0xffff < sVar3) {
    uVar6 = 0;
  }
  *(undefined2 *)(*pacVar5 + 2) = uVar6;
  *(Col_Word *)(*pacVar5 + 0x10) = left;
  *(Col_Word *)(*pacVar5 + 0x18) = right;
  return (Col_Word)pacVar5;
}

Assistant:

static Col_Word
NewMConcatList(
    Col_Word left,  /*!< Left part. */
    Col_Word right) /*!< Right part. */
{
    size_t leftDepth = GetDepth(left), rightDepth = GetDepth(right);
    size_t leftLength = Col_ListLength(left),
            rightLength = Col_ListLength(right);
    Col_Word mconcatNode = (Col_Word) AllocCells(1);
    WORD_MCONCATLIST_INIT(mconcatNode,
            (leftDepth>rightDepth?leftDepth:rightDepth) + 1,
            leftLength + rightLength, leftLength, left, right);
    return mconcatNode;
}